

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretMain.c
# Opt level: O0

void Abc_FlowRetime_UpdateLags_forw_rec(Abc_Obj_t *pObj)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  int local_1c;
  int i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsPi(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Abc_ObjIsPi(pObj)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                  ,0x4cf,"void Abc_FlowRetime_UpdateLags_forw_rec(Abc_Obj_t *)");
  }
  iVar1 = Abc_ObjIsLatch(pObj);
  if (iVar1 == 0) {
    iVar1 = Abc_ObjIsBo(pObj);
    if ((iVar1 == 0) && (iVar1 = Abc_NodeIsTravIdCurrent(pObj), iVar1 == 0)) {
      Abc_NodeSetTravIdCurrent(pObj);
      iVar1 = Abc_ObjIsNode(pObj);
      if (iVar1 != 0) {
        iVar1 = Abc_FlowRetime_GetLag(pObj);
        Abc_FlowRetime_SetLag(pObj,iVar1 + -1);
      }
      for (local_1c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_1c < iVar1; local_1c = local_1c + 1) {
        pObj_00 = Abc_ObjFanin(pObj,local_1c);
        Abc_FlowRetime_UpdateLags_forw_rec(pObj_00);
      }
    }
    return;
  }
  __assert_fail("!Abc_ObjIsLatch(pObj)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretMain.c"
                ,0x4d0,"void Abc_FlowRetime_UpdateLags_forw_rec(Abc_Obj_t *)");
}

Assistant:

void
Abc_FlowRetime_UpdateLags_forw_rec( Abc_Obj_t *pObj ) {
  Abc_Obj_t *pNext;
  int i;

  assert(!Abc_ObjIsPi(pObj));
  assert(!Abc_ObjIsLatch(pObj));

  if (Abc_ObjIsBo(pObj)) return;
  if (Abc_NodeIsTravIdCurrent(pObj)) return;

  Abc_NodeSetTravIdCurrent(pObj);

  if (Abc_ObjIsNode(pObj)) {
    Abc_FlowRetime_SetLag( pObj, -1+Abc_FlowRetime_GetLag(pObj) );
  }

  Abc_ObjForEachFanin( pObj, pNext, i ) {
    Abc_FlowRetime_UpdateLags_forw_rec( pNext );
  }
}